

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

int pmain(lua_State *L)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int status;
  lua_Integer lVar5;
  char **argv;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  uint script;
  uint uVar9;
  ulong n;
  uint uVar10;
  bool bVar11;
  char *local_40;
  
  uVar10 = 0;
  lVar5 = lua_tointegerx(L,1,(int *)0x0);
  argv = (char **)lua_touserdata(L,2);
  pcVar7 = *argv;
  if (pcVar7 == (char *)0x0) {
    script = 0xffffffff;
  }
  else {
    if (*pcVar7 != '\0') {
      progname = pcVar7;
    }
    pcVar7 = argv[1];
    if (pcVar7 == (char *)0x0) {
      script = 0;
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      script = 1;
      do {
        if (*pcVar7 != '-') goto LAB_00106181;
        bVar1 = pcVar7[1];
        if (bVar1 < 0x69) {
          if (bVar1 < 0x57) {
            if (bVar1 == 0x45) {
              if (pcVar7[2] == '\0') {
                uVar10 = uVar10 | 0x10;
                goto LAB_00106134;
              }
            }
            else {
              if (bVar1 == 0) goto LAB_00106181;
              if (bVar1 == 0x2d) {
                uVar3 = 1;
                if (pcVar7[2] == '\0') {
                  uVar3 = uVar10;
                }
                uVar10 = uVar3;
                script = script + (pcVar7[2] == '\0');
                goto LAB_00106181;
              }
            }
          }
          else if (bVar1 == 0x57) {
            if (pcVar7[2] == '\0') goto LAB_00106134;
          }
          else if (bVar1 == 0x65) {
            uVar10 = uVar10 | 8;
            goto LAB_001060f1;
          }
LAB_0010617b:
          uVar10 = 1;
          goto LAB_00106181;
        }
        if (bVar1 == 0x69) {
          uVar10 = uVar10 | 2;
LAB_0010612a:
          if (pcVar7[2] != '\0') goto LAB_0010617b;
          uVar10 = uVar10 | 4;
        }
        else {
          if (bVar1 != 0x6c) {
            if (bVar1 != 0x76) goto LAB_0010617b;
            goto LAB_0010612a;
          }
LAB_001060f1:
          if (pcVar7[2] == '\0') {
            if ((argv[(long)(int)script + 1] == (char *)0x0) ||
               (*argv[(long)(int)script + 1] == '-')) goto LAB_0010617b;
            script = script + 1;
          }
        }
LAB_00106134:
        lVar6 = (long)(int)script;
        script = script + 1;
        pcVar7 = argv[lVar6 + 1];
      } while (pcVar7 != (char *)0x0);
      script = 0;
    }
  }
LAB_00106181:
  uVar9 = (uint)lVar5;
  uVar3 = uVar9;
  if (0 < (int)script) {
    uVar3 = script;
  }
  luaL_checkversion_(L,504.0,0x88);
  if (uVar10 == 1) {
    pmain_cold_1();
    return 0;
  }
  if ((uVar10 & 4) != 0) {
    print_version();
  }
  if ((uVar10 & 0x10) == 0) {
    luaL_openlibs(L);
    createargtable(L,argv,uVar9,script);
    iVar4 = 0;
    lua_gc(L,1);
    lua_gc(L,10,0);
    pcVar7 = getenv("LUA_INIT_5_4");
    if (pcVar7 == (char *)0x0) {
      pcVar7 = getenv("LUA_INIT");
      pcVar8 = "=LUA_INIT";
    }
    else {
      pcVar8 = "=LUA_INIT_5_4";
    }
    if (pcVar7 != (char *)0x0) {
      if (*pcVar7 == '@') {
        iVar4 = luaL_loadfilex(L,pcVar7 + 1,(char *)0x0);
        iVar4 = dochunk(L,iVar4);
      }
      else {
        iVar4 = dostring(L,pcVar7,pcVar8);
      }
    }
    if (iVar4 != 0) {
      return 0;
    }
  }
  else {
    lua_pushboolean(L,1);
    lua_setfield(L,-0xf4628,"LUA_NOENV");
    luaL_openlibs(L);
    createargtable(L,argv,uVar9,script);
    lua_gc(L,1);
    lua_gc(L,10,0);
  }
  if (1 < (int)uVar3) {
    iVar4 = 1;
    do {
      pcVar7 = argv[iVar4];
      cVar2 = pcVar7[1];
      bVar11 = true;
      if (cVar2 == 'W') {
        lua_warning(L,"@on",0);
      }
      else if ((cVar2 == 'l') || (cVar2 == 'e')) {
        if (pcVar7[2] == '\0') {
          pcVar7 = argv[(long)iVar4 + 1];
          iVar4 = iVar4 + 1;
        }
        else {
          pcVar7 = pcVar7 + 2;
        }
        if (cVar2 == 'e') {
          status = dostring(L,pcVar7,"=(command line)");
        }
        else {
          pcVar8 = strchr(pcVar7,0x3d);
          if (pcVar8 == (char *)0x0) {
            local_40 = strchr(pcVar7,0x2d);
            pcVar8 = pcVar7;
          }
          else {
            *pcVar8 = '\0';
            local_40 = (char *)0x0;
            pcVar8 = pcVar8 + 1;
          }
          lua_getglobal(L,"require");
          lua_pushstring(L,pcVar8);
          status = docall(L,1,1);
          if (status == 0) {
            if (local_40 != (char *)0x0) {
              *local_40 = '\0';
            }
            lua_setglobal(L,pcVar7);
          }
          report(L,status);
        }
        bVar11 = status == 0;
      }
      if (!bVar11) {
        return 0;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (int)uVar3);
  }
  if (0 < (int)script) {
    pcVar7 = argv[script];
    iVar4 = strcmp(pcVar7,"-");
    if ((iVar4 == 0) && (iVar4 = strcmp(argv[(ulong)script - 1],"--"), iVar4 != 0)) {
      pcVar7 = (char *)0x0;
    }
    iVar4 = luaL_loadfilex(L,pcVar7,(char *)0x0);
    if (iVar4 == 0) {
      iVar4 = lua_getglobal(L,"arg");
      if (iVar4 != 5) {
        luaL_error(L,"\'arg\' is not a table");
      }
      uVar9 = 0xffffffff;
      lVar5 = luaL_len(L,-1);
      uVar3 = (uint)lVar5;
      luaL_checkstack(L,uVar3 + 3,"too many arguments to script");
      if (0 < (int)uVar3) {
        n = 1;
        iVar4 = -1;
        do {
          lua_rawgeti(L,iVar4,n);
          n = n + 1;
          iVar4 = iVar4 + -1;
        } while (uVar3 + 1 != n);
        uVar9 = ~uVar3;
      }
      lua_rotate(L,uVar9,-1);
      lua_settop(L,-2);
      iVar4 = docall(L,uVar3,-1);
    }
    report(L,iVar4);
    if (iVar4 != 0) {
      return 0;
    }
  }
  if ((uVar10 & 2) == 0) {
    if ((0 < (int)script) || ((uVar10 & 0xc) != 0)) goto LAB_00106550;
    print_version();
  }
  doREPL(L);
LAB_00106550:
  lua_pushboolean(L,1);
  return 1;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  int optlim = (script > 0) ? script : argc; /* first argv not an option */
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (args == has_error) {  /* bad arg? */
    print_usage(argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version();
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  lua_gc(L, LUA_GCRESTART);  /* start GC... */
  lua_gc(L, LUA_GCGEN, 0, 0);  /* ...in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, optlim))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script > 0) {  /* execute main script (if there is one) */
    if (handle_script(L, argv + script) != LUA_OK)
      return 0;  /* interrupt in case of error */
  }
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script < 1 && !(args & (has_e | has_v))) { /* no active option? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version();
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}